

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O2

void __thiscall
ConfidentialAssetId_Constractor_Test::~ConfidentialAssetId_Constractor_Test
          (ConfidentialAssetId_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor) {
  ConfidentialAssetId assetid;

  EXPECT_STREQ(assetid.GetHex().c_str(), "");
  EXPECT_EQ(assetid.GetData().GetDataSize(), 0);
  EXPECT_EQ(assetid.HasBlinding(), false);
  EXPECT_STREQ(assetid.GetUnblindedData().GetHex().c_str(), "");
  EXPECT_TRUE(assetid.IsEmpty());
}